

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O1

int file_checkfile(char *urltype,char *infile,char *outfile)

{
  int iVar1;
  
  iVar1 = file_is_compressed(infile);
  if (iVar1 == 0) {
    if (*outfile != '\0') {
      file_outfile[0] = '\0';
      strncat(file_outfile,outfile,0x400);
    }
  }
  else {
    if (*outfile == '\0') {
      builtin_strncpy(urltype,"compress://",0xc);
    }
    else {
      iVar1 = strncmp(outfile,"mem:",4);
      if (iVar1 != 0) {
        builtin_strncpy(urltype,"compressfile://",0x10);
        iVar1 = strncmp(outfile,"file://",7);
        if (iVar1 == 0) {
          outfile = outfile + 7;
        }
        strcpy(file_outfile,outfile);
        return 0;
      }
      builtin_strncpy(urltype,"compressmem://",0xf);
    }
    file_outfile[0] = '\0';
  }
  return 0;
}

Assistant:

int file_checkfile (char *urltype, char *infile, char *outfile) 
{
    /* special case: if file:// driver, check if the file is compressed */
    if ( file_is_compressed(infile) )
    {
      /* if output file has been specified, save the name for future use: */
      /* This is the name of the uncompressed file to be created on disk. */
      if (strlen(outfile))
      {
        if (!strncmp(outfile, "mem:", 4) )
        {
           /* uncompress the file in memory, with READ and WRITE access */
           strcpy(urltype, "compressmem://");  /* use special driver */
           *file_outfile = '\0';  
        }
        else
        {
          strcpy(urltype, "compressfile://");  /* use special driver */

          /* don't copy the "file://" prefix, if present.  */
          if (!strncmp(outfile, "file://", 7) )
             strcpy(file_outfile,outfile+7);
          else
             strcpy(file_outfile,outfile);
        }
      }
      else
      {
        /* uncompress the file in memory */
        strcpy(urltype, "compress://");  /* use special driver */
        *file_outfile = '\0';  /* no output file was specified */
      }
    }
    else  /* an ordinary, uncompressed FITS file on disk */
    {
        /* save the output file name for later use when opening the file. */
        /* In this case, the file to be opened will be opened READONLY,   */
        /* and copied to this newly created output file.  The original file */
        /* will be closed, and the copy will be opened by CFITSIO for     */
        /* subsequent processing (possibly with READWRITE access).        */
        if (strlen(outfile)) {
	    file_outfile[0] = '\0';
            strncat(file_outfile,outfile,FLEN_FILENAME-1);
        }
    }

    return 0;
}